

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O1

void ctemplate_htmlparser::enter_state_js_slash(statemachine_ctx *ctx,int start,char chr,int end)

{
  jsparser_ctx *js;
  byte bVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  char buffer [18];
  char acStack_38 [24];
  
  if (ctx == (statemachine_ctx *)0x0) {
    __assert_fail("ctx != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                  ,0x1c3,
                  "void ctemplate_htmlparser::enter_state_js_slash(statemachine_ctx *, int, char, int)"
                 );
  }
  js = (jsparser_ctx *)ctx->user;
  if (js == (jsparser_ctx *)0x0) {
    __assert_fail("ctx->user != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                  ,0x1c4,
                  "void ctemplate_htmlparser::enter_state_js_slash(statemachine_ctx *, int, char, int)"
                 );
  }
  iVar3 = js->buffer_end;
  iVar8 = iVar3 - js->buffer_start;
  iVar6 = (iVar3 + 0x12) - js->buffer_start;
  if (-1 < iVar8) {
    iVar6 = iVar8;
  }
  if (iVar6 < 1) {
    uVar9 = 0xffffffff;
  }
  else {
    uVar7 = (iVar3 + -1) % 0x12;
    uVar9 = uVar7 + 0x12;
    if (-1 < (int)uVar7) {
      uVar9 = uVar7;
    }
  }
  if ((int)uVar9 < 0) {
    bVar1 = 0;
  }
  else {
    bVar1 = js->buffer[uVar9];
  }
  uVar9 = 0xfffffffe;
  if (((0x20 < bVar1) || ((0x100001e00U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) && (bVar1 != 0xa0)) {
    uVar9 = ~(uint)(bVar1 == 0xd);
  }
  bVar1 = jsparser_buffer_get(js,uVar9);
  uVar4 = (ulong)bVar1;
  if (bVar1 < 0x40) {
    if ((0xfc00956200000001U >> (uVar4 & 0x3f) & 1) == 0) {
      if (uVar4 == 0x2b) {
        cVar2 = jsparser_buffer_get(js,uVar9 - 1);
        if (cVar2 == '+') goto LAB_001313f9;
      }
      else {
        if (uVar4 != 0x2d) goto LAB_001313d9;
        cVar2 = jsparser_buffer_get(js,uVar9 - 1);
        if (cVar2 == '-') goto LAB_001313f9;
      }
    }
  }
  else {
LAB_001313d9:
    if (((0x23 < bVar1 - 0x5b) || ((0xf00000009U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) == 0)) &&
       ((iVar3 = jsparser_buffer_last_identifier(js,acStack_38), iVar3 == 0 ||
        (pvVar5 = bsearch(acStack_38,regexp_token_prefix,0x2f,8,bsearch_strcmp),
        pvVar5 == (void *)0x0)))) goto LAB_001313f9;
  }
  ctx->next_state = 6;
LAB_001313f9:
  jsparser_buffer_append_chr(js,chr);
  return;
}

Assistant:

static void enter_state_js_slash(statemachine_ctx *ctx, int start, char chr,
                                 int end)
{
  jsparser_ctx *js;
  char buffer[JSPARSER_RING_BUFFER_SIZE];
  int pos;

  assert(ctx != NULL);
  assert(ctx->user != NULL);

  js = CAST(jsparser_ctx *, ctx->user);
  assert(js != NULL);

  pos = -1;
  /* Consume the last whitespace. */
  if (js_is_whitespace(jsparser_buffer_get(js, pos))) {
    --pos;
  }

  switch (jsparser_buffer_get(js, pos)) {
    /* Ignore unary increment */
    case '+':
      if (jsparser_buffer_get(js, pos - 1) != '+') {
        ctx->next_state = JSPARSER_STATE_INT_JS_REGEXP_SLASH;
      }
      break;

    /* Ignore unary decrement */
    case '-':
      if (jsparser_buffer_get(js, pos - 1) != '-') {
        ctx->next_state = JSPARSER_STATE_INT_JS_REGEXP_SLASH;
      }
      break;

    /* List of punctuator endings except ), ], }, + and - */
    case '=':
    case '<':
    case '>':
    case '&':
    case '|':
    case '!':
    case '%':
    case '*':
    case '/':
    case ',':
    case ';':
    case '?':
    case ':':
    case '^':
    case '~':
    case '{':
    case '(':
    case '[':
    case '}':
    case '\0':
      ctx->next_state = JSPARSER_STATE_INT_JS_REGEXP_SLASH;
      break;

    default:
      if (jsparser_buffer_last_identifier(js, buffer) &&
          is_regexp_token_prefix(buffer)) {
        ctx->next_state = JSPARSER_STATE_INT_JS_REGEXP_SLASH;
      }
  }

  jsparser_buffer_append_chr(js, chr);
}